

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.h
# Opt level: O0

int s2pred::TriageSign(S2Point *a,S2Point *b,S2Point *c,Vector3_d *a_cross_b)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  S2LogMessage local_b8;
  S2LogMessageVoidify local_a1;
  double local_a0;
  double det;
  S2LogMessage local_90;
  S2LogMessageVoidify local_7a;
  byte local_79;
  S2LogMessage local_78;
  S2LogMessageVoidify local_65 [20];
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  undefined8 local_38;
  double kMaxDetError;
  Vector3_d *a_cross_b_local;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  
  local_38 = 0x3cbd3d07c84b5dcc;
  kMaxDetError = (double)a_cross_b;
  a_cross_b_local = c;
  c_local = b;
  b_local = a;
  bVar1 = S2::IsUnitLength(a);
  local_51 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.h"
               ,0x108,kFatal,(ostream *)&std::cerr);
    local_51 = 1;
    poVar3 = S2LogMessage::stream(&local_50);
    poVar3 = std::operator<<(poVar3,"Check failed: S2::IsUnitLength(a) ");
    S2LogMessageVoidify::operator&(&local_39,poVar3);
  }
  if ((local_51 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  bVar1 = S2::IsUnitLength(c_local);
  local_79 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.h"
               ,0x109,kFatal,(ostream *)&std::cerr);
    local_79 = 1;
    poVar3 = S2LogMessage::stream(&local_78);
    poVar3 = std::operator<<(poVar3,"Check failed: S2::IsUnitLength(b) ");
    S2LogMessageVoidify::operator&(local_65,poVar3);
  }
  if ((local_79 & 1) == 0) {
    bVar1 = S2::IsUnitLength(a_cross_b_local);
    det._7_1_ = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.h"
                 ,0x10a,kFatal,(ostream *)&std::cerr);
      det._7_1_ = 1;
      poVar3 = S2LogMessage::stream(&local_90);
      poVar3 = std::operator<<(poVar3,"Check failed: S2::IsUnitLength(c) ");
      S2LogMessageVoidify::operator&(&local_7a,poVar3);
    }
    if ((det._7_1_ & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_90);
    }
    dVar4 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)kMaxDetError,a_cross_b_local);
    bVar1 = true;
    local_a0 = dVar4;
    if ((((FLAGS_s2debug & 1U) != 0) && (bVar1 = true, 4.057643110400022e-16 < ABS(dVar4))) &&
       (bVar1 = true, ABS(dVar4) < 4.057643110400022e-14)) {
      iVar2 = ExpensiveSign(b_local,c_local,a_cross_b_local,true);
      bVar1 = 0.0 < dVar4 * (double)iVar2;
    }
    if (!bVar1) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.h"
                 ,0x111,kFatal,(ostream *)&std::cerr);
      poVar3 = S2LogMessage::stream(&local_b8);
      poVar3 = std::operator<<(poVar3,
                               "Check failed: !FLAGS_s2debug || std::fabs(det) <= kMaxDetError || std::fabs(det) >= 100 * kMaxDetError || det * ExpensiveSign(a, b, c) > 0 "
                              );
      S2LogMessageVoidify::operator&(&local_a1,poVar3);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_b8);
    }
    if (local_a0 <= 4.057643110400022e-16) {
      if (-4.057643110400022e-16 <= local_a0) {
        a_local._4_4_ = 0;
      }
      else {
        a_local._4_4_ = -1;
      }
    }
    else {
      a_local._4_4_ = 1;
    }
    return a_local._4_4_;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
}

Assistant:

inline int TriageSign(const S2Point& a, const S2Point& b,
                      const S2Point& c, const Vector3_d& a_cross_b) {
  // kMaxDetError is the maximum error in computing (AxB).C where all vectors
  // are unit length.  Using standard inequalities, it can be shown that
  //
  //  fl(AxB) = AxB + D where |D| <= (|AxB| + (2/sqrt(3))*|A|*|B|) * e
  //
  // where "fl()" denotes a calculation done in floating-point arithmetic,
  // |x| denotes either absolute value or the L2-norm as appropriate, and
  // e = 0.5*DBL_EPSILON.  Similarly,
  //
  //  fl(B.C) = B.C + d where |d| <= (1.5*|B.C| + 1.5*|B|*|C|) * e .
  //
  // Applying these bounds to the unit-length vectors A,B,C and neglecting
  // relative error (which does not affect the sign of the result), we get
  //
  //  fl((AxB).C) = (AxB).C + d where |d| <= (2.5 + 2/sqrt(3)) * e
  //
  // which is about 3.6548 * e, or 1.8274 * DBL_EPSILON.
  const double kMaxDetError = 1.8274 * DBL_EPSILON;
  S2_DCHECK(S2::IsUnitLength(a));
  S2_DCHECK(S2::IsUnitLength(b));
  S2_DCHECK(S2::IsUnitLength(c));
  double det = a_cross_b.DotProd(c);

  // Double-check borderline cases in debug mode.
  S2_DCHECK(!FLAGS_s2debug ||
         std::fabs(det) <= kMaxDetError ||
         std::fabs(det) >= 100 * kMaxDetError ||
         det * ExpensiveSign(a, b, c) > 0);

  if (det > kMaxDetError) return 1;
  if (det < -kMaxDetError) return -1;
  return 0;
}